

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIOHelpers.hpp
# Opt level: O0

void TasGrid::IO::writeNumbers<true,(TasGrid::IO::IOPad)4,unsigned_long,unsigned_long>
               (ostream *os,unsigned_long vals,unsigned_long vals_1)

{
  initializer_list<unsigned_long> __l;
  allocator<unsigned_long> local_59;
  unsigned_long local_58;
  unsigned_long local_50;
  iterator local_48;
  size_type local_40;
  undefined1 local_38 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  unsigned_long vals_local_1;
  unsigned_long vals_local;
  ostream *os_local;
  
  local_48 = &local_58;
  local_40 = 2;
  local_58 = vals;
  local_50 = vals_1;
  values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)vals_1;
  std::allocator<unsigned_long>::allocator(&local_59);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,__l,&local_59);
  std::allocator<unsigned_long>::~allocator(&local_59);
  writeVector<true,(TasGrid::IO::IOPad)4,unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38,os);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_38);
  return;
}

Assistant:

void writeNumbers(std::ostream &os, Vals... vals){
    std::vector<typename std::tuple_element<0, std::tuple<Vals...>>::type> values = {vals...};
    writeVector<iomode, pad>(values, os);
}